

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

int __thiscall deqp::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *this_00;
  TestContext *testCtx;
  int extraout_EAX;
  RenderContext *renderCtx;
  char *fileName;
  size_type sVar1;
  reference ppTVar2;
  int local_48;
  int i;
  undefined1 local_38 [8];
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  ShaderLibraryGroup *this_local;
  
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderCtx = deqp::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  this_00 = &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ShaderLibrary::ShaderLibrary((ShaderLibrary *)this_00,testCtx,renderCtx);
  fileName = (char *)std::__cxx11::string::c_str();
  ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_38,
             (ShaderLibrary *)this_00,fileName);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_38);
    if ((int)sVar1 <= local_48) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_38,
                         (long)local_48);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar2);
    local_48 = local_48 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_38);
  ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void ShaderLibraryGroup::init(void)
{
	deqp::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext());
	std::vector<tcu::TestNode*> children = shaderLibrary.loadShaderFile(m_filename.c_str());

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}